

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::init
          (OperatorPerformanceCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  Functions *pFVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  int iVar5;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestError *pTVar6;
  undefined4 extraout_var_02;
  MessageBuilder *pMVar7;
  size_type sVar8;
  reference pvVar9;
  ShaderProgram *pSVar10;
  reference pvVar11;
  TestLog *pTVar12;
  InitialCalibration *pIVar13;
  CalibratorParameters local_524;
  string local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  LogSection local_488;
  MessageBuilder local_448;
  int local_2c8;
  undefined1 local_2c1;
  int progNdx_1;
  SharedPtr<glu::ShaderProgram> local_1f0;
  string *local_1e0;
  string *frag;
  string *vert;
  undefined1 local_1c8 [4];
  int progNdx;
  MessageBuilder local_1b0;
  long local_20;
  Functions *gl;
  TestLog *log;
  OperatorPerformanceCase *this_local;
  
  log = (TestLog *)this;
  gl = (Functions *)tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_20 = CONCAT44(extraout_var,iVar3);
  while (dVar4 = ::deGetFalse(), dVar4 == 0) {
    iVar3 = this->m_viewportWidth;
    iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_00,iVar5));
    bVar2 = de::inRange<int>(iVar3,1,iVar5);
    if (!bVar2) break;
    iVar3 = this->m_viewportHeight;
    iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_01,iVar5));
    bVar2 = de::inRange<int>(iVar3,1,iVar5);
    if (!bVar2) break;
    dVar4 = ::deGetFalse();
    pFVar1 = gl;
    if (dVar4 == 0) {
      iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      logRenderTargetInfo((TestLog *)pFVar1,(RenderTarget *)CONCAT44(extraout_var_02,iVar3));
      tcu::TestLog::operator<<(&local_1b0,(TestLog *)gl,(BeginMessageToken *)&tcu::TestLog::Message)
      ;
      pMVar7 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [25])"Using additive blending.")
      ;
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
      (**(code **)(local_20 + 0x5e0))(0xbe2);
      (**(code **)(local_20 + 0x100))(0x8006);
      (**(code **)(local_20 + 0x120))(1);
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(local_1c8);
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
      ::operator=(&this->m_programData,
                  (vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                   *)local_1c8);
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
      ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                 *)local_1c8);
      vert._4_4_ = 0;
      while( true ) {
        iVar3 = vert._4_4_;
        sVar8 = std::
                vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                ::size(&this->m_programData);
        if ((int)sVar8 <= iVar3) {
          for (local_2c8 = 0; iVar3 = local_2c8,
              sVar8 = std::
                      vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                      ::size(&this->m_programs), pFVar1 = gl, iVar3 < (int)sVar8;
              local_2c8 = local_2c8 + 1) {
            de::toString<int>(&local_4c8,&local_2c8);
            std::operator+(&local_4a8,"Program",&local_4c8);
            de::toString<int>(&local_508,&local_2c8);
            std::operator+(&local_4e8,"Program ",&local_508);
            tcu::LogSection::LogSection(&local_488,&local_4a8,&local_4e8);
            pTVar12 = tcu::TestLog::operator<<((TestLog *)pFVar1,&local_488);
            tcu::TestLog::operator<<(&local_448,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pvVar9 = std::
                     vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                     ::operator[](&this->m_programData,(long)local_2c8);
            pMVar7 = tcu::MessageBuilder::operator<<(&local_448,&pvVar9->description);
            pTVar12 = tcu::MessageBuilder::operator<<
                                (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
            pvVar11 = std::
                      vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                      ::operator[](&this->m_programs,(long)local_2c8);
            pSVar10 = de::SharedPtr<glu::ShaderProgram>::operator*(pvVar11);
            pTVar12 = glu::operator<<(pTVar12,pSVar10);
            tcu::TestLog::operator<<(pTVar12,(EndSectionToken *)&tcu::TestLog::EndSection);
            tcu::MessageBuilder::~MessageBuilder(&local_448);
            tcu::LogSection::~LogSection(&local_488);
            std::__cxx11::string::~string((string *)&local_4e8);
            std::__cxx11::string::~string((string *)&local_508);
            std::__cxx11::string::~string((string *)&local_4a8);
            std::__cxx11::string::~string((string *)&local_4c8);
          }
          sVar8 = std::
                  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                  ::size(&this->m_programData);
          std::vector<int,_std::allocator<int>_>::resize(&this->m_highWorkloadSizes,sVar8);
          sVar8 = std::
                  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                  ::size(&this->m_programData);
          std::
          vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
          ::resize(&this->m_workloadRecordsFindHigh,sVar8);
          sVar8 = std::
                  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                  ::size(&this->m_programData);
          std::
          vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
          ::resize(&this->m_workloadRecords,sVar8);
          pIVar13 = de::
                    SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
                    ::operator->(&this->m_initialCalibrationStorage);
          deqp::gls::CalibratorParameters::CalibratorParameters
                    (&local_524,pIVar13->initialNumCalls,10,2000.0,0x10,33.333332,16.666666,1000.0);
          deqp::gls::TheilSenCalibrator::clear(&this->m_calibrator,&local_524);
          this->m_state = STATE_CALIBRATING;
          prepareProgram(this,0);
          prepareNextRound(this);
          return extraout_EAX;
        }
        frag = &std::
                vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                ::operator[](&this->m_programData,(long)vert._4_4_)->vertShaderSource;
        pvVar9 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                 ::operator[](&this->m_programData,(long)vert._4_4_);
        local_1e0 = &pvVar9->fragShaderSource;
        pSVar10 = (ShaderProgram *)operator_new(0xd0);
        local_2c1 = 1;
        renderCtx = this->m_renderCtx;
        glu::makeVtxFragSources((ProgramSources *)&progNdx_1,frag,local_1e0);
        glu::ShaderProgram::ShaderProgram(pSVar10,renderCtx,(ProgramSources *)&progNdx_1);
        local_2c1 = 0;
        de::SharedPtr<glu::ShaderProgram>::SharedPtr(&local_1f0,pSVar10);
        std::
        vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
        ::push_back(&this->m_programs,&local_1f0);
        de::SharedPtr<glu::ShaderProgram>::~SharedPtr(&local_1f0);
        glu::ProgramSources::~ProgramSources((ProgramSources *)&progNdx_1);
        pvVar11 = std::
                  vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                  ::back(&this->m_programs);
        pSVar10 = de::SharedPtr<glu::ShaderProgram>::operator->(pvVar11);
        bVar2 = glu::ShaderProgram::isOk(pSVar10);
        pFVar1 = gl;
        if (!bVar2) break;
        vert._4_4_ = vert._4_4_ + 1;
      }
      pvVar11 = std::
                vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                ::back(&this->m_programs);
      pSVar10 = de::SharedPtr<glu::ShaderProgram>::operator*(pvVar11);
      glu::operator<<((TestLog *)pFVar1,pSVar10);
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                 ,0x329);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,(char *)0x0,
             "de::inRange(m_viewportWidth, 1, m_renderCtx.getRenderTarget().getWidth()) && de::inRange(m_viewportHeight, 1, m_renderCtx.getRenderTarget().getHeight())"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
             ,0x311);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void OperatorPerformanceCase::init (void)
{
	TestLog&				log		= m_testCtx.getLog();
	const glw::Functions&	gl		= m_renderCtx.getFunctions();

	// Validate that we have sane grid and viewport setup.
	DE_ASSERT(de::inBounds(m_gridSizeX, 1, 256) && de::inBounds(m_gridSizeY, 1, 256));
	TCU_CHECK(de::inRange(m_viewportWidth,	1, m_renderCtx.getRenderTarget().getWidth()) &&
			  de::inRange(m_viewportHeight,	1, m_renderCtx.getRenderTarget().getHeight()));

	logRenderTargetInfo(log, m_renderCtx.getRenderTarget());

	log << TestLog::Message << "Using additive blending." << TestLog::EndMessage;
	gl.enable(GL_BLEND);
	gl.blendEquation(GL_FUNC_ADD);
	gl.blendFunc(GL_ONE, GL_ONE);

	// Generate programs.
	DE_ASSERT(m_programs.empty());
	m_programData = generateProgramData();
	DE_ASSERT(!m_programData.empty());

	for (int progNdx = 0; progNdx < (int)m_programData.size(); progNdx++)
	{
		const string& vert = m_programData[progNdx].vertShaderSource;
		const string& frag = m_programData[progNdx].fragShaderSource;

		m_programs.push_back(SharedPtr<ShaderProgram>(new ShaderProgram(m_renderCtx, glu::makeVtxFragSources(vert, frag))));

		if (!m_programs.back()->isOk())
		{
			log << *m_programs.back();
			TCU_FAIL("Compile failed");
		}
	}

	// Log all programs.
	for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
		log << TestLog::Section("Program" + de::toString(progNdx), "Program " + de::toString(progNdx))
				<< TestLog::Message << m_programData[progNdx].description << TestLog::EndMessage
				<< *m_programs[progNdx]
			<< TestLog::EndSection;

	m_highWorkloadSizes.resize(m_programData.size());
	m_workloadRecordsFindHigh.resize(m_programData.size());
	m_workloadRecords.resize(m_programData.size());

	m_calibrator.clear(CalibratorParameters(m_initialCalibrationStorage->initialNumCalls, 10 /* calibrate iteration frames */, 2000.0f /* calibrate iteration shortcut threshold (ms) */, 16 /* max calibrate iterations */,
											1000.0f/30.0f /* frame time (ms) */, 1000.0f/60.0f /* frame time cap (ms) */, 1000.0f /* target measure duration (ms) */));
	m_state = STATE_CALIBRATING;

	prepareProgram(0);
	prepareNextRound();
}